

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  bool bVar1;
  DeathTestOutcome DVar2;
  int exit_code;
  Message *pMVar3;
  char *str;
  RE *pRVar4;
  ostream *poVar5;
  String local_90;
  GTestLog local_7c;
  String local_78;
  char *local_68;
  undefined1 local_59;
  char *pcStack_58;
  bool matched;
  Message local_40;
  Message buffer;
  undefined1 local_30 [7];
  bool success;
  String error_message;
  bool status_ok_local;
  DeathTestImpl *this_local;
  
  error_message.length_._7_1_ = status_ok;
  bVar1 = spawned(this);
  if (bVar1) {
    GetCapturedStderr();
    buffer.ss_._7_1_ = 0;
    Message::Message(&local_40);
    pMVar3 = Message::operator<<(&local_40,(char (*) [13])"Death test: ");
    pcStack_58 = statement(this);
    pMVar3 = Message::operator<<(pMVar3,&stack0xffffffffffffffa8);
    Message::operator<<(pMVar3,(char (*) [2])0x2073e8);
    DVar2 = outcome(this);
    switch(DVar2) {
    case IN_PROGRESS:
    default:
      GTestLog::GTestLog(&local_7c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                         ,0x197a);
      poVar5 = GTestLog::GetStream(&local_7c);
      std::operator<<(poVar5,"DeathTest::Passed somehow called before conclusion of test");
      GTestLog::~GTestLog(&local_7c);
      break;
    case DIED:
      if ((error_message.length_._7_1_ & 1) == 0) {
        pMVar3 = Message::operator<<(&local_40,
                                     (char (*) [51])
                                     "    Result: died but not with expected exit code:\n");
        pMVar3 = Message::operator<<(pMVar3,(char (*) [13])"            ");
        exit_code = status(this);
        ExitSummary((internal *)&local_78,exit_code);
        pMVar3 = Message::operator<<(pMVar3,&local_78);
        Message::operator<<(pMVar3,(char (*) [2])0x2073e8);
        String::~String(&local_78);
      }
      else {
        str = String::c_str((String *)local_30);
        pRVar4 = regex(this);
        local_59 = RE::PartialMatch(str,pRVar4);
        if ((bool)local_59) {
          buffer.ss_._7_1_ = 1;
        }
        else {
          pMVar3 = Message::operator<<(&local_40,
                                       (char (*) [47])
                                       "    Result: died but not with expected error.\n");
          pMVar3 = Message::operator<<(pMVar3,(char (*) [13])"  Expected: ");
          pRVar4 = regex(this);
          local_68 = RE::pattern(pRVar4);
          pMVar3 = Message::operator<<(pMVar3,&local_68);
          pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x2073e8);
          pMVar3 = Message::operator<<(pMVar3,(char (*) [13])"Actual msg: ");
          Message::operator<<(pMVar3,(String *)local_30);
        }
      }
      break;
    case LIVED:
      pMVar3 = Message::operator<<(&local_40,(char (*) [28])"    Result: failed to die.\n");
      pMVar3 = Message::operator<<(pMVar3,(char (*) [13])" Error msg: ");
      Message::operator<<(pMVar3,(String *)local_30);
      break;
    case RETURNED:
      pMVar3 = Message::operator<<(&local_40,
                                   (char (*) [47])"    Result: illegal return in test statement.\n")
      ;
      pMVar3 = Message::operator<<(pMVar3,(char (*) [13])" Error msg: ");
      Message::operator<<(pMVar3,(String *)local_30);
    }
    Message::GetString((Message *)&local_90);
    DeathTest::set_last_death_test_message(&local_90);
    String::~String(&local_90);
    this_local._7_1_ = (bool)(buffer.ss_._7_1_ & 1);
    Message::~Message(&local_40);
    String::~String((String *)local_30);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const String error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg: " << error_message;
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg: " << error_message;
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg: " << error_message;
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n";
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}